

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [3])

{
  long *local_20;
  
  testing::Message::Message((Message *)&local_20);
  std::operator<<((ostream *)(local_20 + 2),*value);
  AppendMessage(this,(Message *)&local_20);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }